

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

byte * __thiscall
Memory::LargeHeapBlock::GetRealAddressFromInterior(LargeHeapBlock *this,void *interiorAddress)

{
  LargeObjectHeader *header_00;
  code *pcVar1;
  bool bVar2;
  LargeObjectHeader **ppLVar3;
  undefined4 *puVar4;
  byte *pbVar5;
  byte *startAddress;
  LargeObjectHeader *header;
  uint i;
  void *interiorAddress_local;
  LargeHeapBlock *this_local;
  
  header._4_4_ = 0;
  do {
    if (this->allocCount <= header._4_4_) {
      return (byte *)0x0;
    }
    ppLVar3 = HeaderList(this);
    header_00 = ppLVar3[header._4_4_];
    if ((header_00 != (LargeObjectHeader *)0x0) &&
       (bVar2 = IsPartialSweptHeader(this,header_00), !bVar2)) {
      if (header_00->objectIndex != header._4_4_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x3ca,"(header->objectIndex == i)","header->objectIndex == i");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pbVar5 = (byte *)LargeObjectHeader::GetAddress(header_00);
      if ((pbVar5 <= interiorAddress) && (interiorAddress < pbVar5 + header_00->objectSize)) {
        return pbVar5;
      }
    }
    header._4_4_ = header._4_4_ + 1;
  } while( true );
}

Assistant:

byte *
LargeHeapBlock::GetRealAddressFromInterior(void * interiorAddress)
{
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->HeaderList()[i];

#if ENABLE_PARTIAL_GC && ENABLE_CONCURRENT_GC
        if (header != nullptr && !IsPartialSweptHeader(header))
#else
        if (header != nullptr)
#endif
        {
            Assert(header->objectIndex == i);
            byte * startAddress = (byte *)header->GetAddress();
            if (startAddress <= interiorAddress && (startAddress + header->objectSize > interiorAddress))
            {
                return startAddress;
            }
        }
    }

    return nullptr;
}